

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

void find_top_ref(int64_t *ref_frame_rd)

{
  long lVar1;
  int64_t ref_copy [7];
  long local_58;
  int64_t iStack_50;
  int64_t local_48;
  int64_t iStack_40;
  int64_t local_38;
  int64_t iStack_30;
  int64_t local_28;
  
  lVar1 = 0x7fffffffffffffff;
  local_28 = ref_frame_rd[7];
  local_58 = ref_frame_rd[1];
  iStack_50 = ref_frame_rd[2];
  local_48 = ref_frame_rd[3];
  iStack_40 = ref_frame_rd[4];
  local_38 = ref_frame_rd[5];
  iStack_30 = ref_frame_rd[6];
  qsort(&local_58,7,8,compare_int64);
  if (local_58 != 0x7fffffffffffffff) {
    lVar1 = (local_58 * 0x6e) / 100;
  }
  *ref_frame_rd = lVar1;
  return;
}

Assistant:

static inline void find_top_ref(int64_t ref_frame_rd[REF_FRAMES]) {
  assert(ref_frame_rd[0] == INT64_MAX);
  int64_t ref_copy[REF_FRAMES - 1];
  memcpy(ref_copy, ref_frame_rd + 1,
         sizeof(ref_frame_rd[0]) * (REF_FRAMES - 1));
  qsort(ref_copy, REF_FRAMES - 1, sizeof(int64_t), compare_int64);

  int64_t cutoff = ref_copy[0];
  // The cut-off is within 10% of the best.
  if (cutoff != INT64_MAX) {
    assert(cutoff < INT64_MAX / 200);
    cutoff = (110 * cutoff) / 100;
  }
  ref_frame_rd[0] = cutoff;
}